

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void test_key_exchange(ptls_key_exchange_algorithm_t *algo)

{
  ptls_iovec_t pVar1;
  int iVar2;
  ptls_iovec_t server_secret;
  ptls_key_exchange_context_t *ctx;
  ptls_iovec_t server_pubkey;
  ptls_iovec_t client_secret;
  ptls_iovec_t client_pubkey;
  ptls_iovec_t local_78;
  st_ptls_key_exchange_context_t *local_68;
  ptls_iovec_t local_60;
  ptls_iovec_t local_50;
  ptls_iovec_t local_40;
  
  iVar2 = (*algo->exchange)(&local_60,&local_78,(ptls_iovec_t)ZEXT816(0));
  _ok((uint)(iVar2 != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0x158);
  iVar2 = (*algo->create)(&local_68,&local_40);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0x15c);
  iVar2 = (*algo->exchange)(&local_60,&local_78,local_40);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0x15e);
  pVar1.len = local_60.len;
  pVar1.base = local_60.base;
  iVar2 = (*local_68->on_exchange)(local_68,&local_50,pVar1);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0x160);
  _ok((uint)(local_50.len == local_78.len),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0x161);
  iVar2 = bcmp(local_50.base,local_78.base,local_50.len);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0x162);
  free(local_50.base);
  free(local_60.base);
  free(local_78.base);
  return;
}

Assistant:

void test_key_exchange(ptls_key_exchange_algorithm_t *algo)
{
    ptls_key_exchange_context_t *ctx;
    ptls_iovec_t client_pubkey, client_secret, server_pubkey, server_secret;
    int ret;

    /* fail */
    ret = algo->exchange(&server_pubkey, &server_secret, (ptls_iovec_t){NULL});
    ok(ret != 0);

    /* perform ecdh */
    ret = algo->create(&ctx, &client_pubkey);
    ok(ret == 0);
    ret = algo->exchange(&server_pubkey, &server_secret, client_pubkey);
    ok(ret == 0);
    ret = ctx->on_exchange(ctx, &client_secret, server_pubkey);
    ok(ret == 0);
    ok(client_secret.len == server_secret.len);
    ok(memcmp(client_secret.base, server_secret.base, client_secret.len) == 0);

    free(client_secret.base);
    free(server_pubkey.base);
    free(server_secret.base);
}